

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mdspan.h
# Opt level: O0

index_type __thiscall
Gudhi::layout_right::
mapping<Gudhi::extents<unsigned_long,18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>const>
::operator()(mapping<Gudhi::extents<unsigned_long,18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>const>
             *this,initializer_list<unsigned_long> *indices)

{
  value_type vVar1;
  ulong uVar2;
  size_type sVar3;
  rank_type rVar4;
  const_iterator pvVar5;
  index_type iVar6;
  undefined8 *puVar7;
  value_type stride;
  const_iterator __end0;
  const_iterator __begin0;
  array<unsigned_long,_3UL> *__range3;
  const_iterator puStack_38;
  uint i;
  const_iterator it;
  index_type newIndex;
  initializer_list<unsigned_long> *indices_local;
  mapping<const_Gudhi::extents<unsigned_long,_18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>_>
  *this_local;
  
  sVar3 = std::initializer_list<unsigned_long>::size(indices);
  rVar4 = extents<unsigned_long,_18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
          ::rank();
  if (sVar3 != rVar4) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = "Wrong number of parameters.";
    __cxa_throw(puVar7,&char_const*::typeinfo,0);
  }
  it = (const_iterator)0x0;
  puStack_38 = std::initializer_list<unsigned_long>::begin(indices);
  __range3._4_4_ = 0;
  __end0 = std::array<unsigned_long,_3UL>::begin((array<unsigned_long,_3UL> *)(this + 0x28));
  pvVar5 = std::array<unsigned_long,_3UL>::end((array<unsigned_long,_3UL> *)(this + 0x28));
  while( true ) {
    if (__end0 == pvVar5) {
      return (index_type)it;
    }
    vVar1 = *__end0;
    uVar2 = *puStack_38;
    iVar6 = extents<unsigned_long,_18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
            ::extent((extents<unsigned_long,_18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                      *)this,(ulong)__range3._4_4_);
    if (iVar6 <= uVar2) break;
    it = (const_iterator)(vVar1 * *puStack_38 + (long)it);
    puStack_38 = puStack_38 + 1;
    __range3._4_4_ = __range3._4_4_ + 1;
    __end0 = __end0 + 1;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = "Out of bound index.";
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

constexpr index_type operator()(const IndexRange& indices) const
    {
      GUDHI_CHECK(indices.size() == extents_type::rank(), "Wrong number of parameters.");

      index_type newIndex = 0;
      auto it = indices.begin();
      GUDHI_CHECK_code(unsigned int i = 0);
      for (auto stride : ext_shifts_) {
        GUDHI_CHECK_code(GUDHI_CHECK(*it < exts_.extent(i), "Out of bound index."));
        newIndex += (stride * (*it));
        ++it;
        GUDHI_CHECK_code(++i);
      }

      return newIndex;
    }